

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfocusframe.cpp
# Opt level: O1

void __thiscall QFocusFrame::paintEvent(QFocusFrame *this,QPaintEvent *param_1)

{
  long lVar1;
  int iVar2;
  int iVar3;
  QStyle *pQVar4;
  QWidgetPrivate *this_00;
  long in_FS_OFFSET;
  QRect QVar5;
  QStyleOption option;
  undefined1 *local_a8;
  undefined1 *puStack_a0;
  undefined1 *local_98;
  QFocusFrame *pQStack_90;
  QStyle *local_88;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  QPalettePrivate *pQStack_50;
  undefined1 *local_48;
  QObject *pQStack_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QWidget).field_0x8;
  if (*(long *)(lVar1 + 600) != 0) {
    local_88 = (QStyle *)&DAT_aaaaaaaaaaaaaaaa;
    local_98 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_90 = (QFocusFrame *)&DAT_aaaaaaaaaaaaaaaa;
    QPainter::QPainter((QPainter *)&local_98);
    pQStack_90 = this;
    local_88 = QWidget::style(&this->super_QWidget);
    QPainter::begin((QPaintDevice *)&local_98);
    QPainter::setRenderHint((RenderHint)(QRect *)&local_98,true);
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_40 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_50 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
    QStyleOption::QStyleOption((QStyleOption *)&local_78,1,0);
    (**(code **)(*(long *)&this->super_QWidget + 0x1a0))(this,(QStyleOption *)&local_78);
    pQVar4 = QWidget::style(&this->super_QWidget);
    iVar2 = (**(code **)(*(long *)pQVar4 + 0xe0))(pQVar4,0x40,(QStyleOption *)&local_78,this);
    pQVar4 = QWidget::style(&this->super_QWidget);
    iVar3 = (**(code **)(*(long *)pQVar4 + 0xe0))(pQVar4,0x41,(QStyleOption *)&local_78,this);
    this_00 = qt_widget_private(*(QWidget **)(lVar1 + 600));
    local_a8 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_a0 = &DAT_aaaaaaaaaaaaaaaa;
    QVar5 = QWidgetPrivate::clipRect(this_00);
    local_a8 = QVar5._0_8_;
    puStack_a0 = (undefined1 *)CONCAT44(QVar5.y2.m_i.m_i + iVar2 * 2,QVar5.x2.m_i.m_i + iVar3 * 2);
    QPainter::setClipRect((QRect *)&local_98,(ClipOperation)&local_a8);
    (**(code **)(*(long *)local_88 + 0xb8))
              (local_88,0x26,(QStyleOption *)&local_78,(QRect *)&local_98,pQStack_90);
    QStyleOption::~QStyleOption((QStyleOption *)&local_78);
    QPainter::~QPainter((QPainter *)&local_98);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void
QFocusFrame::paintEvent(QPaintEvent *)
{
    Q_D(QFocusFrame);

    if (!d->widget)
        return;

    QStylePainter p(this);
    QStyleOption option;
    initStyleOption(&option);
    const int vmargin = style()->pixelMetric(QStyle::PM_FocusFrameVMargin, &option, this);
    const int hmargin = style()->pixelMetric(QStyle::PM_FocusFrameHMargin, &option, this);
    QWidgetPrivate *wd = qt_widget_private(d->widget);
    QRect rect = wd->clipRect().adjusted(0, 0, hmargin*2, vmargin*2);
    p.setClipRect(rect);
    p.drawControl(QStyle::CE_FocusFrame, option);
}